

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4280d61::DumpVisitor::onValue(DumpVisitor *this,int64_t S,bool LEB)

{
  raw_ostream *this_00;
  byte *__n;
  byte bVar1;
  size_t in_RCX;
  undefined7 in_register_00000011;
  byte *__buf;
  byte *extraout_RDX;
  bool bVar2;
  ulong local_28;
  
  __buf = (byte *)CONCAT71(in_register_00000011,LEB);
  this_00 = this->OS;
  if ((int)__buf == 0) {
    local_28 = (ulong)S >> 0x38 | (S & 0xff000000000000U) >> 0x28 | (S & 0xff0000000000U) >> 0x18 |
               (S & 0xff00000000U) >> 8 | (S & 0xff000000U) << 8 | (S & 0xff0000U) << 0x18 |
               (S & 0xff00U) << 0x28 | S << 0x38;
    if (((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
        IsLittleEndian != false) {
      local_28 = S;
    }
    llvm::raw_ostream::write(this_00,(int)&local_28,&DAT_00000008,in_RCX);
  }
  else {
    do {
      bVar2 = 0x3f < (ulong)S && ((S & 0x40U) == 0 || S >> 7 != 0xffffffffffffffff);
      bVar1 = bVar2 << 7 | (byte)S & 0x7f;
      __n = (byte *)this_00->OutBufCur;
      if (__n < this_00->OutBufEnd) {
        __buf = __n + 1;
        this_00->OutBufCur = (char *)__buf;
        *__n = bVar1;
      }
      else {
        llvm::raw_ostream::write(this_00,(uint)bVar1,__buf,(size_t)__n);
        __buf = extraout_RDX;
      }
      S = S >> 7;
    } while (bVar2);
  }
  return;
}

Assistant:

void onValue(const int64_t S, const bool LEB = false) override {
    if (LEB)
      encodeSLEB128(S, OS);
    else
      writeInteger(S, OS, DebugInfo.IsLittleEndian);
  }